

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlParserInputBufferRead(void)

{
  int iVar1;
  int iVar2;
  int val;
  xmlParserInputBufferPtr val_00;
  int local_2c;
  int n_len;
  int len;
  int n_in;
  xmlParserInputBufferPtr in;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (n_len = 0; n_len < 8; n_len = n_len + 1) {
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      iVar1 = xmlMemBlocks();
      val_00 = gen_xmlParserInputBufferPtr(n_len,0);
      iVar2 = gen_int(local_2c,1);
      val = xmlParserInputBufferRead(val_00,iVar2);
      desret_int(val);
      call_tests = call_tests + 1;
      des_xmlParserInputBufferPtr(n_len,val_00,0);
      des_int(local_2c,iVar2,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlParserInputBufferRead",(ulong)(uint)(iVar2 - iVar1));
        ret_val = ret_val + 1;
        printf(" %d",(ulong)(uint)n_len);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlParserInputBufferRead(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    xmlParserInputBufferPtr in; /* a buffered parser input */
    int n_in;
    int len; /* indicative value of the amount of chars to read */
    int n_len;

    for (n_in = 0;n_in < gen_nb_xmlParserInputBufferPtr;n_in++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
        mem_base = xmlMemBlocks();
        in = gen_xmlParserInputBufferPtr(n_in, 0);
        len = gen_int(n_len, 1);

        ret_val = xmlParserInputBufferRead(in, len);
        desret_int(ret_val);
        call_tests++;
        des_xmlParserInputBufferPtr(n_in, in, 0);
        des_int(n_len, len, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlParserInputBufferRead",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_in);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    function_tests++;

    return(test_ret);
}